

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

void newBinGE(IntView<0> x,IntView<0> y,BoolView *r)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  BinGE<0,_0,_0> *this;
  BinGE<0,_4,_0> *this_00;
  BinGE<0,_1,_0> *this_01;
  BinGE<0,_5,_0> *this_02;
  BinGE<1,_0,_0> *this_03;
  BinGE<5,_0,_0> *this_04;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  IntVar *pIVar8;
  uint uVar9;
  ulong uVar10;
  IntVar *pIVar11;
  uint uVar12;
  ulong uVar13;
  IntView<0> _x;
  IntView<0> _x_00;
  IntView<0> _x_01;
  IntView<0> _x_02;
  IntView<0> _x_03;
  IntView<0> _x_04;
  IntView<0> _x_05;
  IntView<0> _x_06;
  IntView<1> _x_07;
  IntView<1> _x_08;
  IntView<5> _x_09;
  IntView<5> _x_10;
  IntView<0> _y;
  IntView<0> _y_00;
  IntView<4> _y_01;
  IntView<4> _y_02;
  IntView<1> _y_03;
  IntView<1> _y_04;
  IntView<5> _y_05;
  IntView<5> _y_06;
  IntView<0> _y_07;
  IntView<0> _y_08;
  IntView<0> _y_09;
  IntView<0> _y_10;
  BoolView local_f0;
  BoolView local_e0;
  BoolView local_d0;
  BoolView local_c0;
  BoolView local_b0;
  BoolView local_a0;
  BoolView local_90;
  BoolView local_80;
  BoolView local_70;
  BoolView local_60;
  BoolView local_50;
  BoolView local_40;
  
  uVar6 = y._8_8_;
  pIVar8 = y.var;
  uVar10 = x._8_8_;
  pIVar11 = x.var;
  uVar13 = uVar10 & 0xffffffff00000000;
  uVar4 = uVar6 & 0xffffffff00000000;
  uVar9 = x.a;
  uVar3 = -uVar9;
  if (0 < (int)uVar9) {
    uVar3 = uVar9;
  }
  uVar9 = (uint)(uVar10 >> 0x1f) & 1;
  uVar12 = uVar9 + 2;
  if (uVar3 < 2) {
    uVar12 = uVar9;
  }
  uVar9 = uVar12 + 4;
  if (uVar10 >> 0x20 == 0) {
    uVar9 = uVar12;
  }
  uVar5 = y.a;
  uVar12 = -uVar5;
  if (0 < (int)uVar5) {
    uVar12 = uVar5;
  }
  uVar5 = (uint)(uVar6 >> 0x1f) & 1;
  uVar7 = uVar5 + 2;
  if (uVar12 < 2) {
    uVar7 = uVar5;
  }
  uVar5 = uVar7 + 4;
  if (uVar6 >> 0x20 == 0) {
    uVar5 = uVar7;
  }
  if (uVar5 == 0 && uVar9 == 0) {
    cVar1 = sat.assigns.data[(uint)r->v];
    bVar2 = r->s;
    this = (BinGE<0,_0,_0> *)operator_new(0x48);
    _x._8_8_ = uVar3 | uVar13;
    _y._8_8_ = uVar12 | uVar4;
    if ((uint)bVar2 * -2 + 1 == (int)cVar1) {
      local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_40.v = r->v;
      local_40.s = r->s;
      _x.var = pIVar11;
      _y.var = pIVar8;
      BinGE<0,_0,_0>::BinGE(this,_x,_y,&local_40);
    }
    else {
      local_50.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_50.v = r->v;
      local_50.s = r->s;
      _x_00.a = (int)_x._8_8_;
      _x_00.b = (int)(_x._8_8_ >> 0x20);
      _x_00.var = pIVar11;
      _y_00.a = (int)_y._8_8_;
      _y_00.b = (int)(_y._8_8_ >> 0x20);
      _y_00.var = pIVar8;
      BinGE<0,_0,_1>::BinGE((BinGE<0,_0,_1> *)this,_x_00,_y_00,&local_50);
    }
  }
  if ((uVar9 == 0) && (uVar5 == 4)) {
    cVar1 = sat.assigns.data[(uint)r->v];
    bVar2 = r->s;
    this_00 = (BinGE<0,_4,_0> *)operator_new(0x48);
    _x_01._8_8_ = uVar3 | uVar13;
    _y_01._8_8_ = uVar12 | uVar4;
    if ((uint)bVar2 * -2 + 1 == (int)cVar1) {
      local_60.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_60.v = r->v;
      local_60.s = r->s;
      _x_01.var = pIVar11;
      _y_01.var = pIVar8;
      BinGE<0,_4,_0>::BinGE(this_00,_x_01,_y_01,&local_60);
    }
    else {
      local_70.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_70.v = r->v;
      local_70.s = r->s;
      _x_02.a = (int)_x_01._8_8_;
      _x_02.b = (int)(_x_01._8_8_ >> 0x20);
      _x_02.var = pIVar11;
      _y_02.a = (int)_y_01._8_8_;
      _y_02.b = (int)(_y_01._8_8_ >> 0x20);
      _y_02.var = pIVar8;
      BinGE<0,_4,_1>::BinGE((BinGE<0,_4,_1> *)this_00,_x_02,_y_02,&local_70);
    }
  }
  if ((uVar9 == 0) && (uVar5 == 1)) {
    cVar1 = sat.assigns.data[(uint)r->v];
    bVar2 = r->s;
    this_01 = (BinGE<0,_1,_0> *)operator_new(0x48);
    _x_03._8_8_ = uVar3 | uVar13;
    _y_03._8_8_ = uVar12 | uVar4;
    if ((uint)bVar2 * -2 + 1 == (int)cVar1) {
      local_80.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_80.v = r->v;
      local_80.s = r->s;
      _x_03.var = pIVar11;
      _y_03.var = pIVar8;
      BinGE<0,_1,_0>::BinGE(this_01,_x_03,_y_03,&local_80);
    }
    else {
      local_90.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_90.v = r->v;
      local_90.s = r->s;
      _x_04.a = (int)_x_03._8_8_;
      _x_04.b = (int)(_x_03._8_8_ >> 0x20);
      _x_04.var = pIVar11;
      _y_04.a = (int)_y_03._8_8_;
      _y_04.b = (int)(_y_03._8_8_ >> 0x20);
      _y_04.var = pIVar8;
      BinGE<0,_1,_1>::BinGE((BinGE<0,_1,_1> *)this_01,_x_04,_y_04,&local_90);
    }
  }
  if ((uVar9 == 0) && (uVar5 == 5)) {
    cVar1 = sat.assigns.data[(uint)r->v];
    bVar2 = r->s;
    this_02 = (BinGE<0,_5,_0> *)operator_new(0x48);
    _x_05._8_8_ = uVar3 | uVar13;
    _y_05._8_8_ = uVar12 | uVar4;
    if ((uint)bVar2 * -2 + 1 == (int)cVar1) {
      local_a0.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_a0.v = r->v;
      local_a0.s = r->s;
      _x_05.var = pIVar11;
      _y_05.var = pIVar8;
      BinGE<0,_5,_0>::BinGE(this_02,_x_05,_y_05,&local_a0);
    }
    else {
      local_b0.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_b0.v = r->v;
      local_b0.s = r->s;
      _x_06.a = (int)_x_05._8_8_;
      _x_06.b = (int)(_x_05._8_8_ >> 0x20);
      _x_06.var = pIVar11;
      _y_06.a = (int)_y_05._8_8_;
      _y_06.b = (int)(_y_05._8_8_ >> 0x20);
      _y_06.var = pIVar8;
      BinGE<0,_5,_1>::BinGE((BinGE<0,_5,_1> *)this_02,_x_06,_y_06,&local_b0);
    }
  }
  if ((uVar9 == 1) && (uVar5 == 0)) {
    cVar1 = sat.assigns.data[(uint)r->v];
    bVar2 = r->s;
    this_03 = (BinGE<1,_0,_0> *)operator_new(0x48);
    _y_07._8_8_ = uVar12 | uVar4;
    _x_07._8_8_ = uVar3 | uVar13;
    if ((uint)bVar2 * -2 + 1 == (int)cVar1) {
      local_c0.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_c0.v = r->v;
      local_c0.s = r->s;
      _x_07.var = pIVar11;
      _y_07.var = pIVar8;
      BinGE<1,_0,_0>::BinGE(this_03,_x_07,_y_07,&local_c0);
    }
    else {
      local_d0.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_d0.v = r->v;
      local_d0.s = r->s;
      _x_08.a = (int)_x_07._8_8_;
      _x_08.b = (int)(_x_07._8_8_ >> 0x20);
      _x_08.var = pIVar11;
      _y_08.a = (int)_y_07._8_8_;
      _y_08.b = (int)(_y_07._8_8_ >> 0x20);
      _y_08.var = pIVar8;
      BinGE<1,_0,_1>::BinGE((BinGE<1,_0,_1> *)this_03,_x_08,_y_08,&local_d0);
    }
  }
  if ((uVar9 == 5) && (uVar5 == 0)) {
    cVar1 = sat.assigns.data[(uint)r->v];
    bVar2 = r->s;
    this_04 = (BinGE<5,_0,_0> *)operator_new(0x48);
    if ((uint)bVar2 * -2 + 1 == (int)cVar1) {
      _y_09._8_8_ = uVar4 | uVar12;
      local_e0.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_e0.v = r->v;
      local_e0.s = r->s;
      _x_09._8_8_ = uVar13 | uVar3;
      _x_09.var = pIVar11;
      _y_09.var = pIVar8;
      BinGE<5,_0,_0>::BinGE(this_04,_x_09,_y_09,&local_e0);
    }
    else {
      _y_10._8_8_ = uVar4 | uVar12;
      local_f0.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_f0.v = r->v;
      local_f0.s = r->s;
      _x_10._8_8_ = uVar13 | uVar3;
      _x_10.var = pIVar11;
      _y_10.var = pIVar8;
      BinGE<5,_0,_1>::BinGE((BinGE<5,_0,_1> *)this_04,_x_10,_y_10,&local_f0);
    }
  }
  return;
}

Assistant:

void newBinGE(IntView<> x, IntView<> y, const BoolView& r = bv_true) {
	const int u = x.getType();
	const int v = y.getType();
	Propagator* p = nullptr;

	BinProp(BinGE, 0, 0);
	BinProp(BinGE, 0, 4);
	BinProp(BinGE, 0, 1);
	BinProp(BinGE, 0, 5);
	BinProp(BinGE, 1, 0);
	BinProp(BinGE, 5, 0);

	assert(p);
}